

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

string * __thiscall
kratos::Var::handle_name_abi_cxx11_(string *__return_storage_ptr__,Var *this,Generator *scope)

{
  int iVar1;
  long lVar2;
  VarException *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_e0;
  string local_c0;
  Var *local_a0;
  Generator *local_98;
  undefined8 local_90;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_88;
  size_type sStack_70;
  undefined1 *local_68;
  string var_name;
  string gen_name;
  
  Generator::handle_name_abi_cxx11_((string *)((long)&var_name.field_2 + 8),scope);
  (*(this->super_IRNode)._vptr_IRNode[0x20])(&local_68,this);
  lVar2 = std::__cxx11::string::find((char *)&local_68,var_name.field_2._8_8_,0);
  if (lVar2 == 0) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_68);
    if ((size_type *)local_68 != &var_name._M_string_length) {
      operator_delete(local_68,var_name._M_string_length + 1);
    }
    if ((size_type *)var_name.field_2._8_8_ != &gen_name._M_string_length) {
      operator_delete((void *)var_name.field_2._8_8_,gen_name._M_string_length + 1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  Generator::handle_name_abi_cxx11_(&local_c0,(Generator *)CONCAT44(extraout_var,iVar1));
  local_88.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)var_name.field_2._8_8_;
  local_88.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)gen_name._M_dataplus._M_p;
  local_88.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c0._M_dataplus._M_p;
  sStack_70 = local_c0._M_string_length;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x1e;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_88;
  fmt::v7::detail::vformat_abi_cxx11_
            (&local_e0,(detail *)"{0} is not accessible from {1}",format_str,args);
  local_a0 = this;
  local_98 = scope;
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])(this);
  local_90 = CONCAT44(extraout_var_00,iVar1);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_a0;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_88,__l,(allocator_type *)(gen_name.field_2._M_local_buf + 0xf));
  VarException::VarException(this_00,&local_e0,&local_88);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string Var::handle_name(kratos::Generator *scope) const {
    // subtract the scope
    auto gen_name = scope->handle_name();
    auto var_name = handle_name();
    auto pos = var_name.find(gen_name);
    if (pos != 0) {
        throw VarException(
            ::format("{0} is not accessible from {1}", gen_name, generator()->handle_name()),
            {this, scope, this->generator()});
    }
    // we +1 because there is a dot there
    return var_name.substr(pos + gen_name.size() + 1);
}